

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glDestroyContext(MOJOSHADER_glContext *_ctx)

{
  MOJOSHADER_glContext *local_20;
  MOJOSHADER_glContext *current_ctx;
  MOJOSHADER_glContext *_ctx_local;
  
  local_20 = ctx;
  ctx = _ctx;
  MOJOSHADER_glBindProgram((MOJOSHADER_glProgram *)0x0);
  if (ctx->linker_cache != (HashTable *)0x0) {
    hash_destroy(ctx->linker_cache);
  }
  lookup_entry_points((MOJOSHADER_glGetProcAddress)0x0,(void *)0x0);
  Free(ctx);
  if (local_20 == _ctx) {
    local_20 = (MOJOSHADER_glContext *)0x0;
  }
  else {
  }
  ctx = local_20;
  return;
}

Assistant:

void MOJOSHADER_glDestroyContext(MOJOSHADER_glContext *_ctx)
{
    MOJOSHADER_glContext *current_ctx = ctx;
    ctx = _ctx;
    MOJOSHADER_glBindProgram(NULL);
    if (ctx->linker_cache)
        hash_destroy(ctx->linker_cache);
    lookup_entry_points(NULL, NULL);   // !!! FIXME: is there a value to this?
    Free(ctx);
    ctx = ((current_ctx == _ctx) ? NULL : current_ctx);
}